

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__write_callbacks(uv_stream_t *stream)

{
  int iVar1;
  uv__queue *q_00;
  size_t sVar2;
  undefined1 local_30 [8];
  uv__queue pq;
  uv__queue *q;
  uv_write_t *req;
  uv_stream_t *stream_local;
  
  iVar1 = uv__queue_empty(&stream->write_completed_queue);
  if (iVar1 == 0) {
    uv__queue_move(&stream->write_completed_queue,(uv__queue *)local_30);
    while (iVar1 = uv__queue_empty((uv__queue *)local_30), iVar1 == 0) {
      q_00 = uv__queue_head((uv__queue *)local_30);
      pq.prev = q_00;
      uv__queue_remove(q_00);
      if ((stream->loop->active_reqs).count == 0) {
        __assert_fail("uv__has_active_reqs(stream->loop)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/stream.c"
                      ,0x393,"void uv__write_callbacks(uv_stream_t *)");
      }
      (stream->loop->active_reqs).count = (stream->loop->active_reqs).count - 1;
      if (q_00[1].prev != (uv__queue *)0x0) {
        sVar2 = uv__write_req_size((uv_write_t *)&q_00[-6].prev);
        stream->write_queue_size = stream->write_queue_size - sVar2;
        if (q_00[1].prev != (uv__queue *)&q_00[2].prev) {
          uv__free(q_00[1].prev);
        }
        q_00[1].prev = (uv__queue *)0x0;
      }
      if (q_00[-2].prev != (uv__queue *)0x0) {
        (*(code *)q_00[-2].prev)(&q_00[-6].prev,*(undefined4 *)((long)&q_00[2].next + 4));
      }
    }
  }
  return;
}

Assistant:

static void uv__write_callbacks(uv_stream_t* stream) {
  uv_write_t* req;
  struct uv__queue* q;
  struct uv__queue pq;

  if (uv__queue_empty(&stream->write_completed_queue))
    return;

  uv__queue_move(&stream->write_completed_queue, &pq);

  while (!uv__queue_empty(&pq)) {
    /* Pop a req off write_completed_queue. */
    q = uv__queue_head(&pq);
    req = uv__queue_data(q, uv_write_t, queue);
    uv__queue_remove(q);
    uv__req_unregister(stream->loop, req);

    if (req->bufs != NULL) {
      stream->write_queue_size -= uv__write_req_size(req);
      if (req->bufs != req->bufsml)
        uv__free(req->bufs);
      req->bufs = NULL;
    }

    /* NOTE: call callback AFTER freeing the request data. */
    if (req->cb)
      req->cb(req, req->error);
  }
}